

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)

{
  sxu32 local_34;
  sxu32 *psStack_30;
  sxu32 nIdx;
  VmSlot *pSlot;
  jx9_value *pObj;
  sxu32 *pIdx_local;
  jx9_vm *pVm_local;
  
  pSlot = (VmSlot *)0x0;
  local_34 = 0xffffffff;
  pObj = (jx9_value *)pIdx;
  pIdx_local = (sxu32 *)pVm;
  psStack_30 = (sxu32 *)SySetPop(&pVm->aFreeObj);
  if (psStack_30 != (sxu32 *)0x0) {
    pSlot = (VmSlot *)SySetAt((SySet *)(pIdx_local + 0x80),*psStack_30);
    local_34 = *psStack_30;
  }
  if ((pSlot == (VmSlot *)0x0) &&
     (pSlot = (VmSlot *)VmReserveMemObj((jx9_vm *)pIdx_local,&local_34),
     (jx9_value *)pSlot == (jx9_value *)0x0)) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    jx9MemObjInit((jx9_vm *)pIdx_local,(jx9_value *)pSlot);
    if (pObj != (jx9_value *)0x0) {
      *(sxu32 *)&pObj->x = local_34;
    }
    *(sxu32 *)&pSlot[3].pUserData = local_34;
    pVm_local = (jx9_vm *)pSlot;
  }
  return (jx9_value *)pVm_local;
}

Assistant:

JX9_PRIVATE jx9_value * jx9VmReserveMemObj(jx9_vm *pVm,sxu32 *pIdx)
{
	jx9_value *pObj = 0;
	VmSlot *pSlot;
	sxu32 nIdx;
	/* Check for a free slot */
	nIdx = SXU32_HIGH; /* cc warning */
	pSlot = (VmSlot *)SySetPop(&pVm->aFreeObj);
	if( pSlot ){
		pObj = (jx9_value *)SySetAt(&pVm->aMemObj, pSlot->nIdx);
		nIdx = pSlot->nIdx;
	}
	if( pObj == 0 ){
		/* Reserve a new memory object */
		pObj = VmReserveMemObj(&(*pVm), &nIdx);
		if( pObj == 0 ){
			return 0;
		}
	}
	/* Set a null default value */
	jx9MemObjInit(&(*pVm), pObj);
	if( pIdx ){
		*pIdx = nIdx;
	}
	pObj->nIdx = nIdx;
	return pObj;
}